

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::WriteTextures(ColladaExporter *this)

{
  ulong uVar1;
  string *__lhs;
  string *__lhs_00;
  aiTexture *texture;
  IOSystem *pIVar2;
  int iVar3;
  aiScene *paVar4;
  IOStream *file;
  DeadlyImportError *this_00;
  uint uVar5;
  uint number;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 local_530 [40];
  ColladaExporter *local_508;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
  *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  char str [1024];
  undefined4 extraout_var;
  
  paVar4 = this->mScene;
  uVar5 = paVar4->mNumTextures;
  if (uVar5 == 0 || paVar4->mTextures == (aiTexture **)0x0) {
    return;
  }
  __lhs = &this->mFile;
  __lhs_00 = &this->mPath;
  local_500 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
               *)&this->textures;
  uVar8 = 0;
  while( true ) {
    uVar1 = uVar8 - 1;
    do {
      uVar7 = uVar1;
      uVar1 = uVar7 + 1;
      if (uVar5 <= uVar1) {
        return;
      }
      texture = paVar4->mTextures[uVar7 + 1];
      number = (int)uVar8 + 1;
      uVar8 = (ulong)number;
    } while (texture == (aiTexture *)0x0);
    local_508 = this;
    ASSIMP_itoa10(str,0x400,number);
    std::operator+(&local_478,__lhs,"_texture_");
    pcVar6 = "";
    if (uVar1 < 1000) {
      pcVar6 = "0";
    }
    std::operator+(&local_4b8,&local_478,pcVar6);
    pcVar6 = "";
    if (uVar1 < 100) {
      pcVar6 = "0";
    }
    std::operator+(&local_458,&local_4b8,pcVar6);
    pcVar6 = "";
    if (uVar1 < 10) {
      pcVar6 = "0";
    }
    std::operator+(&local_4d8,&local_458,pcVar6);
    std::operator+(&local_4f8,&local_4d8,str);
    this = local_508;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530,
                   &local_4f8,".");
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_530,texture->achFormatHint);
    std::__cxx11::string::~string((string *)local_530);
    std::__cxx11::string::~string((string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_458);
    std::__cxx11::string::~string((string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_478);
    pIVar2 = this->mIOSystem;
    iVar3 = (*pIVar2->_vptr_IOSystem[3])(pIVar2);
    std::operator+(&local_4f8,__lhs_00,(char)iVar3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530,
                   &local_4f8,&name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,"wb",(allocator<char> *)&local_458);
    iVar3 = (*pIVar2->_vptr_IOSystem[4])
                      (pIVar2,CONCAT44(local_530._4_4_,local_530._0_4_),local_4d8._M_dataplus._M_p);
    file = (IOStream *)CONCAT44(extraout_var,iVar3);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::__cxx11::string::~string((string *)local_530);
    std::__cxx11::string::~string((string *)&local_4f8);
    if (file == (IOStream *)0x0) break;
    if (texture->mHeight == 0) {
      (*file->_vptr_IOStream[3])(file,texture->pcData,(ulong)texture->mWidth,1);
    }
    else {
      Bitmap::Save(texture,file);
    }
    (*file->_vptr_IOStream[7])(file);
    local_530._0_4_ = (undefined4)uVar1;
    std::__cxx11::string::string((string *)(local_530 + 8),(string *)&name);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,std::__cxx11::string>,std::_Select1st<std::pair<unsigned_int_const,std::__cxx11::string>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::__cxx11::string>>>
    ::_M_emplace_unique<std::pair<unsigned_int,std::__cxx11::string>>
              (local_500,
               (pair<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_530);
    uVar8 = uVar7 + 2;
    std::__cxx11::string::~string((string *)(local_530 + 8));
    (*file->_vptr_IOStream[1])(file);
    std::__cxx11::string::~string((string *)&name);
    paVar4 = this->mScene;
    uVar5 = paVar4->mNumTextures;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_4f8,"could not open output texture file: ",__lhs_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530,
                 &local_4f8,&name);
  DeadlyImportError::DeadlyImportError(this_00,(string *)local_530);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ColladaExporter::WriteTextures() {
    static const unsigned int buffer_size = 1024;
    char str[buffer_size];

    if (mScene->HasTextures()) {
        for(unsigned int i = 0; i < mScene->mNumTextures; i++) {
            // It would be great to be able to create a directory in portable standard C++, but it's not the case,
            // so we just write the textures in the current directory.

            aiTexture* texture = mScene->mTextures[i];
            if ( nullptr == texture ) {
                continue;
            }

            ASSIMP_itoa10(str, buffer_size, i + 1);

            std::string name = mFile + "_texture_" + (i < 1000 ? "0" : "") + (i < 100 ? "0" : "") + (i < 10 ? "0" : "") + str + "." + ((const char*) texture->achFormatHint);

            std::unique_ptr<IOStream> outfile(mIOSystem->Open(mPath + mIOSystem->getOsSeparator() + name, "wb"));
            if(outfile == NULL) {
                throw DeadlyExportError("could not open output texture file: " + mPath + name);
            }

            if(texture->mHeight == 0) {
                outfile->Write((void*) texture->pcData, texture->mWidth, 1);
            } else {
                Bitmap::Save(texture, outfile.get());
            }

            outfile->Flush();

            textures.insert(std::make_pair(i, name));
        }
    }
}